

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> __thiscall
wabt::MakeUnique<wabt::FuncModuleField,wabt::Location>(wabt *this,Location *args)

{
  Location *loc;
  FuncModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (FuncModuleField *)operator_new(0x148);
  loc = local_18;
  string_view::string_view(&local_28);
  FuncModuleField::FuncModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::FuncModuleField,std::default_delete<wabt::FuncModuleField>>::
  unique_ptr<std::default_delete<wabt::FuncModuleField>,void>
            ((unique_ptr<wabt::FuncModuleField,std::default_delete<wabt::FuncModuleField>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}